

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O3

Error __thiscall llvm::DWARFUnit::tryExtractDIEsIfNeeded(DWARFUnit *this,bool CUDieOnly)

{
  DWARFSection **__return_storage_ptr__;
  char cVar1;
  _func_int **pp_Var2;
  DWARFSection *pDVar3;
  byte bVar4;
  int iVar5;
  long *plVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t uVar8;
  uint32_t uVar9;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar10;
  size_type *psVar11;
  int in_EDX;
  undefined7 in_register_00000031;
  DWARFUnit *this_00;
  pointer pDVar12;
  pointer pDVar13;
  Optional<unsigned_long> OVar14;
  undefined1 auVar15 [16];
  error_code EC;
  error_code EC_00;
  Twine local_198;
  undefined1 auStack_180 [8];
  DWARFDataExtractor DA;
  DWARFDataExtractor RangesDA;
  Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> StringOffsetOrError;
  char local_100;
  byte local_98;
  undefined1 local_90 [8];
  DWARFDie UnitDie;
  undefined1 local_70 [16];
  DWARFAbbreviationDeclaration *local_60;
  ulong local_58;
  string local_50;
  DWARFObject *pDVar7;
  
  this_00 = (DWARFUnit *)CONCAT71(in_register_00000031,CUDieOnly);
  if (in_EDX == 0) {
    pDVar12 = (this_00->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pDVar13 = (this_00->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    pDVar12 = (this_00->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar13 = pDVar12;
    if (pDVar12 !=
        (this_00->DieArray).
        super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) goto LAB_00d7855c;
  }
  if (1 < (ulong)(((long)pDVar12 - (long)pDVar13 >> 3) * -0x5555555555555555)) goto LAB_00d7855c;
  extractDIEsToVector(this_00,pDVar13 == pDVar12,(bool)((byte)in_EDX ^ 1),&this_00->DieArray);
  UnitDie.U = (DWARFUnit *)
              (this_00->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
  if ((UnitDie.U ==
       (DWARFUnit *)
       (this_00->DieArray).
       super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>.
       _M_impl.super__Vector_impl_data._M_finish) || (pDVar13 != pDVar12)) goto LAB_00d7855c;
  __return_storage_ptr__ = &RangesDA.Section;
  local_90 = (undefined1  [8])this_00;
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)__return_storage_ptr__,(DWARFDie *)local_90,
                 DW_AT_GNU_dwo_id);
  if (local_100 != '\0') {
    OVar14 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)&RangesDA.Section);
    if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if ((this_00->Header).DWOId.Storage.hasVal == true) {
        if ((this_00->Header).DWOId.Storage.field_0.value != OVar14.Storage.field_0.value) {
          __assert_fail("(!DWOId || *DWOId == Id) && \"setting DWOId to a different value\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFUnit.h"
                        ,0x59,"void llvm::DWARFUnitHeader::setDWOId(uint64_t)");
        }
      }
      else {
        (this_00->Header).DWOId.Storage.hasVal = true;
      }
      (this_00->Header).DWOId.Storage.field_0.value = (unsigned_long)OVar14.Storage.field_0;
    }
  }
  bVar4 = this_00->IsDWO;
  if ((bool)bVar4 == false) {
    if (this_00->AddrOffsetSectionBase != 0) {
      __assert_fail("AddrOffsetSectionBase == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFUnit.cpp"
                    ,0x1ae,"Error llvm::DWARFUnit::tryExtractDIEsIfNeeded(bool)");
    }
    if (this_00->RangeSectionBase != 0) {
      __assert_fail("RangeSectionBase == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFUnit.cpp"
                    ,0x1af,"Error llvm::DWARFUnit::tryExtractDIEsIfNeeded(bool)");
    }
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)__return_storage_ptr__,(DWARFDie *)local_90,
                   DW_AT_addr_base);
    if (local_100 == '\0') {
      this_00->AddrOffsetSectionBase = 0;
LAB_00d78656:
      DWARFDie::find((Optional<llvm::DWARFFormValue> *)__return_storage_ptr__,(DWARFDie *)local_90,
                     DW_AT_GNU_addr_base);
      uVar9 = 0;
      if (local_100 == '\x01') {
        OVar14 = DWARFFormValue::getAsSectionOffset((DWARFFormValue *)&RangesDA.Section);
        uVar9 = 0;
        if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          uVar9 = OVar14.Storage.field_0._0_4_;
        }
      }
      this_00->AddrOffsetSectionBase = uVar9;
    }
    else {
      OVar14 = DWARFFormValue::getAsSectionOffset((DWARFFormValue *)&RangesDA.Section);
      uVar9 = 0;
      if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar9 = OVar14.Storage.field_0._0_4_;
      }
      this_00->AddrOffsetSectionBase = uVar9;
      if (uVar9 == 0) goto LAB_00d78656;
    }
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)__return_storage_ptr__,(DWARFDie *)local_90,
                   DW_AT_rnglists_base);
    if (local_100 == '\x01') {
      OVar14 = DWARFFormValue::getAsSectionOffset((DWARFFormValue *)&RangesDA.Section);
      aVar10.value = 0;
      if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        aVar10.value = OVar14.Storage.field_0.value;
      }
    }
    else {
      aVar10.value = 0;
    }
    this_00->RangeSectionBase = (uint64_t)aVar10;
    bVar4 = this_00->IsDWO;
  }
  DA.Obj = (DWARFObject *)this_00->StringOffsetSection;
  DA.super_DataExtractor._16_8_ =
       (this_00->Context->DObj)._M_t.
       super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
       .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  DA.super_DataExtractor.Data.Length._0_1_ = this_00->isLittleEndian;
  auStack_180 = (undefined1  [8])((StringRef *)&(DA.Obj)->_vptr_DWARFObject)->Data;
  DA.super_DataExtractor.Data.Data = ((DA.Obj)->Dummy).Data.Data;
  DA.super_DataExtractor.Data.Length._1_1_ = 0;
  if ((bVar4 & 1) == 0) {
    if ((this_00->Header).FormParams.Version < 5) goto LAB_00d7855c;
    determineStringOffsetsTableContribution
              ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *)
               &RangesDA.Section,this_00,(DWARFDataExtractor *)auStack_180);
  }
  else {
    determineStringOffsetsTableContributionDWO
              ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *)
               &RangesDA.Section,this_00,(DWARFDataExtractor *)auStack_180);
  }
  if ((StringOffsetOrError.field_0.TStorage.buffer[0x18] & 1U) == 0) {
    *(undefined8 *)((long)&(this_00->StringOffsetsTableContribution).Storage.field_0 + 0x10) =
         StringOffsetOrError.field_0._8_8_;
    *(undefined8 *)&(this_00->StringOffsetsTableContribution).Storage.hasVal =
         StringOffsetOrError.field_0._16_8_;
    *(undefined4 *)&(this_00->StringOffsetsTableContribution).Storage.field_0 =
         RangesDA.Section._0_4_;
    *(undefined4 *)((long)&(this_00->StringOffsetsTableContribution).Storage.field_0 + 4) =
         RangesDA.Section._4_4_;
    *(undefined4 *)((long)&(this_00->StringOffsetsTableContribution).Storage.field_0 + 8) =
         StringOffsetOrError.field_0._0_4_;
    *(undefined4 *)((long)&(this_00->StringOffsetsTableContribution).Storage.field_0 + 0xc) =
         StringOffsetOrError.field_0._4_4_;
  }
  else {
    auVar15 = std::_V2::generic_category();
    pDVar3 = RangesDA.Section;
    RangesDA.Section = (DWARFSection *)0x0;
    local_60 = (DWARFAbbreviationDeclaration *)((ulong)pDVar3 | 1);
    toString_abi_cxx11_((string *)&UnitDie.Die,(llvm *)&local_60,auVar15._8_8_);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&UnitDie.Die,0,(char *)0x0,0xe60c27);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_50.field_2._M_allocated_capacity = *psVar11;
      local_50.field_2._8_8_ = plVar6[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar11;
      local_50._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_50._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    Twine::Twine(&local_198,&local_50);
    Twine::str_abi_cxx11_((string *)&DA.Section,&local_198);
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = this;
    createStringError(EC,auVar15._0_8_);
    if (DA.Section != (DWARFSection *)&RangesDA.super_DataExtractor.Data.Length) {
      operator_delete(DA.Section,
                      CONCAT62(RangesDA.super_DataExtractor.Data.Length._2_6_,
                               CONCAT11(RangesDA.super_DataExtractor.Data.Length._1_1_,
                                        (undefined1)RangesDA.super_DataExtractor.Data.Length)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (UnitDie.Die != (DWARFDebugInfoEntry *)local_70) {
      operator_delete(UnitDie.Die,local_70._0_8_ + 1);
    }
    if ((long *)((ulong)local_60 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_60 & 0xfffffffffffffffe) + 8))();
    }
  }
  if (((StringOffsetOrError.field_0.TStorage.buffer[0x18] & 1U) != 0) &&
     (RangesDA.Section != (DWARFSection *)0x0)) {
    (**(code **)(((RangesDA.Section)->Data).Data + 8))();
  }
  if ((StringOffsetOrError.field_0.TStorage.buffer[0x18] & 1U) != 0) {
    return (Error)this;
  }
  if (4 < (this_00->Header).FormParams.Version) {
    pp_Var2 = ((this_00->Context->DObj)._M_t.
               super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
               .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
              _vptr_DWARFObject;
    if (this_00->IsDWO == true) {
      iVar5 = (*pp_Var2[0x22])();
      pDVar7 = (DWARFObject *)CONCAT44(extraout_var,iVar5);
      this_00->RangeSection = (DWARFSection *)pDVar7;
      this_00->RangeSectionBase = 0;
      aVar10.value = 0;
    }
    else {
      iVar5 = (*pp_Var2[0x13])();
      pDVar7 = (DWARFObject *)CONCAT44(extraout_var_00,iVar5);
      DWARFDie::find((Optional<llvm::DWARFFormValue> *)&RangesDA.Section,(DWARFDie *)local_90,
                     DW_AT_rnglists_base);
      if (local_100 == '\x01') {
        OVar14 = DWARFFormValue::getAsSectionOffset((DWARFFormValue *)&RangesDA.Section);
        aVar10.value = 0;
        if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          aVar10.value = OVar14.Storage.field_0.value;
        }
      }
      else {
        aVar10.value = 0;
      }
      this_00->RangeSection = (DWARFSection *)pDVar7;
      this_00->RangeSectionBase = (uint64_t)aVar10;
    }
    RangesDA.super_DataExtractor.Data.Data = (pDVar7->Dummy).Data.Data;
    if (RangesDA.super_DataExtractor.Data.Data != (char *)0x0) {
      RangesDA.super_DataExtractor._16_8_ =
           (this_00->Context->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
      RangesDA.super_DataExtractor.Data.Length._0_1_ = this_00->isLittleEndian;
      DA.Section = (DWARFSection *)((StringRef *)&pDVar7->_vptr_DWARFObject)->Data;
      RangesDA.super_DataExtractor.Data.Length._1_1_ = 0;
      RangesDA.Obj = pDVar7;
      parseRngListTableHeader
                ((Expected<llvm::DWARFDebugRnglistTable> *)&RangesDA.Section,
                 (DWARFDataExtractor *)&DA.Section,aVar10.value,(this_00->Header).FormParams.Format)
      ;
      if ((local_98 & 1) != 0) {
        auVar15 = std::_V2::generic_category();
        pDVar3 = RangesDA.Section;
        RangesDA.Section = (DWARFSection *)0x0;
        local_58 = (ulong)pDVar3 | 1;
        toString_abi_cxx11_((string *)&UnitDie.Die,(llvm *)&local_58,auVar15._8_8_);
        std::operator+(&local_50,"parsing a range list table: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &UnitDie.Die);
        Twine::Twine(&local_198,&local_50);
        EC_00._M_cat = (error_category *)0x16;
        EC_00._0_8_ = this;
        createStringError(EC_00,auVar15._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (UnitDie.Die != (DWARFDebugInfoEntry *)local_70) {
          operator_delete(UnitDie.Die,local_70._0_8_ + 1);
        }
        if ((long *)(local_58 & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)(local_58 & 0xfffffffffffffffe) + 8))();
        }
        Expected<llvm::DWARFDebugRnglistTable>::~Expected
                  ((Expected<llvm::DWARFDebugRnglistTable> *)&RangesDA.Section);
        return (Error)this;
      }
      optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::operator=
                (&(this_00->RngListTable).Storage,(DWARFDebugRnglistTable *)&RangesDA.Section);
      if ((this_00->IsDWO == true) && ((this_00->RngListTable).Storage.hasVal == true)) {
        cVar1 = *(char *)((long)&(this_00->RngListTable).Storage.field_0 + 0x28);
        uVar8 = 0xc;
        if (cVar1 != '\0') {
          if (cVar1 != '\x01') {
            llvm_unreachable_internal
                      ("Invalid DWARF format (expected DWARF32 or DWARF64",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFListTable.h"
                       ,0x73);
          }
          uVar8 = 0x14;
        }
        this_00->RangeSectionBase = uVar8;
      }
      Expected<llvm::DWARFDebugRnglistTable>::~Expected
                ((Expected<llvm::DWARFDebugRnglistTable> *)&RangesDA.Section);
    }
  }
LAB_00d7855c:
  this->_vptr_DWARFUnit = (_func_int **)0x1;
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFUnit::tryExtractDIEsIfNeeded(bool CUDieOnly) {
  if ((CUDieOnly && !DieArray.empty()) ||
      DieArray.size() > 1)
    return Error::success(); // Already parsed.

  bool HasCUDie = !DieArray.empty();
  extractDIEsToVector(!HasCUDie, !CUDieOnly, DieArray);

  if (DieArray.empty())
    return Error::success();

  // If CU DIE was just parsed, copy several attribute values from it.
  if (HasCUDie)
    return Error::success();

  DWARFDie UnitDie(this, &DieArray[0]);
  if (Optional<uint64_t> DWOId = toUnsigned(UnitDie.find(DW_AT_GNU_dwo_id)))
    Header.setDWOId(*DWOId);
  if (!IsDWO) {
    assert(AddrOffsetSectionBase == 0);
    assert(RangeSectionBase == 0);
    AddrOffsetSectionBase = toSectionOffset(UnitDie.find(DW_AT_addr_base), 0);
    if (!AddrOffsetSectionBase)
      AddrOffsetSectionBase =
          toSectionOffset(UnitDie.find(DW_AT_GNU_addr_base), 0);
    RangeSectionBase = toSectionOffset(UnitDie.find(DW_AT_rnglists_base), 0);
  }

  // In general, in DWARF v5 and beyond we derive the start of the unit's
  // contribution to the string offsets table from the unit DIE's
  // DW_AT_str_offsets_base attribute. Split DWARF units do not use this
  // attribute, so we assume that there is a contribution to the string
  // offsets table starting at offset 0 of the debug_str_offsets.dwo section.
  // In both cases we need to determine the format of the contribution,
  // which may differ from the unit's format.
  DWARFDataExtractor DA(Context.getDWARFObj(), StringOffsetSection,
                        isLittleEndian, 0);
  if (IsDWO || getVersion() >= 5) {
    auto StringOffsetOrError =
        IsDWO ? determineStringOffsetsTableContributionDWO(DA)
              : determineStringOffsetsTableContribution(DA);
    if (!StringOffsetOrError)
      return createStringError(errc::invalid_argument,
                               "invalid reference to or invalid content in "
                               ".debug_str_offsets[.dwo]: " +
                                   toString(StringOffsetOrError.takeError()));

    StringOffsetsTableContribution = *StringOffsetOrError;
  }

  // DWARF v5 uses the .debug_rnglists and .debug_rnglists.dwo sections to
  // describe address ranges.
  if (getVersion() >= 5) {
    if (IsDWO)
      setRangesSection(&Context.getDWARFObj().getRnglistsDWOSection(), 0);
    else
      setRangesSection(&Context.getDWARFObj().getRnglistsSection(),
                       toSectionOffset(UnitDie.find(DW_AT_rnglists_base), 0));
    if (RangeSection->Data.size()) {
      // Parse the range list table header. Individual range lists are
      // extracted lazily.
      DWARFDataExtractor RangesDA(Context.getDWARFObj(), *RangeSection,
                                  isLittleEndian, 0);
      auto TableOrError = parseRngListTableHeader(RangesDA, RangeSectionBase,
                                                  Header.getFormat());
      if (!TableOrError)
        return createStringError(errc::invalid_argument,
                                 "parsing a range list table: " +
                                     toString(TableOrError.takeError()));

      RngListTable = TableOrError.get();

      // In a split dwarf unit, there is no DW_AT_rnglists_base attribute.
      // Adjust RangeSectionBase to point past the table header.
      if (IsDWO && RngListTable)
        RangeSectionBase = RngListTable->getHeaderSize();
    }
  }

  // Don't fall back to DW_AT_GNU_ranges_base: it should be ignored for
  // skeleton CU DIE, so that DWARF users not aware of it are not broken.
  return Error::success();
}